

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void ts_stack_delete(Stack *self)

{
  StackNodeArray *pool;
  StackSlice *__ptr;
  StackIterator *__ptr_00;
  StackNode **__ptr_01;
  ulong uVar1;
  long lVar2;
  
  __ptr = (self->slices).contents;
  if (__ptr != (StackSlice *)0x0) {
    free(__ptr);
    (self->slices).contents = (StackSlice *)0x0;
    (self->slices).size = 0;
    (self->slices).capacity = 0;
  }
  __ptr_00 = (self->iterators).contents;
  if (__ptr_00 != (StackIterator *)0x0) {
    free(__ptr_00);
    (self->iterators).contents = (StackIterator *)0x0;
    (self->iterators).size = 0;
    (self->iterators).capacity = 0;
  }
  pool = &self->node_pool;
  stack_node_release(self->base_node,pool,self->subtree_pool);
  if ((self->heads).size != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      stack_head_delete((StackHead *)((long)&((self->heads).contents)->node + lVar2),pool,
                        self->subtree_pool);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x28;
    } while (uVar1 < (self->heads).size);
  }
  (self->heads).size = 0;
  __ptr_01 = (self->node_pool).contents;
  if (__ptr_01 != (StackNode **)0x0) {
    if ((self->node_pool).size != 0) {
      uVar1 = 0;
      do {
        free((self->node_pool).contents[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (self->node_pool).size);
      __ptr_01 = pool->contents;
    }
    free(__ptr_01);
    pool->contents = (StackNode **)0x0;
    (self->node_pool).size = 0;
    (self->node_pool).capacity = 0;
  }
  free((self->heads).contents);
  free(self);
  return;
}

Assistant:

void ts_stack_delete(Stack *self) {
  if (self->slices.contents)
    array_delete(&self->slices);
  if (self->iterators.contents)
    array_delete(&self->iterators);
  stack_node_release(self->base_node, &self->node_pool, self->subtree_pool);
  for (uint32_t i = 0; i < self->heads.size; i++) {
    stack_head_delete(&self->heads.contents[i], &self->node_pool, self->subtree_pool);
  }
  array_clear(&self->heads);
  if (self->node_pool.contents) {
    for (uint32_t i = 0; i < self->node_pool.size; i++)
      ts_free(self->node_pool.contents[i]);
    array_delete(&self->node_pool);
  }
  array_delete(&self->heads);
  ts_free(self);
}